

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_gather.c
# Opt level: O1

REF_STATUS
ref_gather_cell_id_tec
          (REF_NODE ref_node,REF_CELL ref_cell,REF_INT cell_id,REF_LONG ncell_expected,REF_GLOB *l2c
          ,REF_BOOL binary,FILE *file)

{
  long *plVar1;
  REF_STATUS RVar2;
  uint uVar3;
  uint uVar4;
  void *pvVar5;
  REF_GLOB *pRVar6;
  size_t sVar7;
  ulong uVar8;
  ulong uVar9;
  undefined8 uVar10;
  REF_LONG ref_private_status_reis_ai;
  REF_MPI ref_mpi;
  char *pcVar11;
  REF_INT RVar12;
  long lVar13;
  int iVar14;
  REF_LONG ref_private_status_reis_bi;
  size_t sVar15;
  ulong uVar16;
  REF_INT ncell;
  REF_INT part;
  REF_INT nodes [27];
  REF_GLOB globals [27];
  REF_STATUS local_1c8;
  int local_1c4;
  void *local_1c0;
  int local_1b4;
  size_t local_1b0;
  REF_GLOB *local_1a8;
  void *local_1a0;
  REF_NODE local_198;
  REF_INT local_18c;
  REF_MPI local_188;
  size_t local_180;
  REF_INT local_178 [28];
  REF_GLOB aRStack_108 [27];
  
  local_1a0 = (void *)CONCAT44(local_1a0._4_4_,binary);
  ref_mpi = ref_node->ref_mpi;
  uVar4 = ref_cell->node_per;
  uVar16 = (ulong)uVar4;
  local_1c0 = (void *)CONCAT44(local_1c0._4_4_,cell_id);
  local_1a8 = l2c;
  local_198 = ref_node;
  local_180 = ncell_expected;
  if ((ref_mpi->id == 0) && (0 < ref_cell->max)) {
    iVar14 = 0;
    local_1b0 = 0;
    local_188 = ref_mpi;
    do {
      RVar2 = ref_cell_nodes(ref_cell,iVar14,local_178);
      if ((RVar2 == 0) && (local_178[ref_cell->node_per] == cell_id)) {
        uVar3 = ref_cell_part(ref_cell,local_198,iVar14,&local_1b4);
        if (uVar3 != 0) {
          printf("%s: %d: %s: %d %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c",
                 0x28c,"ref_gather_cell_id_tec",(ulong)uVar3,"part");
          return uVar3;
        }
        if (ref_mpi->id == local_1b4) {
          if (0 < (int)uVar4) {
            uVar8 = 0;
            do {
              aRStack_108[uVar8] = local_1a8[local_178[uVar8]];
              uVar8 = uVar8 + 1;
            } while (uVar16 != uVar8);
          }
          if ((int)local_1a0 == 0) {
            if (0 < (int)uVar4) {
              uVar8 = 0;
              do {
                aRStack_108[uVar8] = aRStack_108[uVar8] + 1;
                fprintf((FILE *)file," %ld");
                uVar8 = uVar8 + 1;
              } while (uVar16 != uVar8);
            }
            fputc(10,(FILE *)file);
          }
          else if (0 < (int)uVar4) {
            uVar8 = 0;
            do {
              local_1c4 = (int)aRStack_108[uVar8];
              sVar15 = fwrite(&local_1c4,4,1,(FILE *)file);
              if (sVar15 != 1) {
                printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
                       "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c"
                       ,0x295,"ref_gather_cell_id_tec","int c2n",1,sVar15);
                return 1;
              }
              uVar8 = uVar8 + 1;
            } while (uVar16 != uVar8);
          }
          local_1b0 = local_1b0 + 1;
          ref_mpi = local_188;
        }
        cell_id = (REF_INT)local_1c0;
      }
      iVar14 = iVar14 + 1;
    } while (iVar14 < ref_cell->max);
  }
  else {
    local_1b0 = 0;
  }
  if (ref_mpi->id == 0) {
    sVar15 = local_1b0;
    if (1 < ref_mpi->n) {
      local_198 = (REF_NODE)(uVar16 * 8);
      RVar12 = 1;
      local_188 = ref_mpi;
      do {
        uVar3 = ref_mpi_gather_recv(local_188,&local_1c4,1,1,RVar12);
        if (uVar3 != 0) {
          printf("%s: %d: %s: %d %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c",
                 0x2a7,"ref_gather_cell_id_tec",(ulong)uVar3,"recv ncell");
          return uVar3;
        }
        uVar3 = local_1c4 * uVar4;
        if ((int)uVar3 < 0) {
          uVar10 = 0x2a8;
          goto LAB_0013fb9f;
        }
        local_18c = RVar12;
        pvVar5 = malloc((ulong)uVar3 * 8);
        if (pvVar5 == (void *)0x0) {
          pcVar11 = "malloc c2n of REF_GLOB NULL";
          uVar10 = 0x2a8;
          goto LAB_0013fbf4;
        }
        local_1c0 = pvVar5;
        pRVar6 = (REF_GLOB *)malloc((ulong)uVar3 << 2);
        RVar12 = local_18c;
        if (pRVar6 == (REF_GLOB *)0x0) {
          pcVar11 = "malloc int_c2n of REF_INT NULL";
          uVar10 = 0x2a9;
          goto LAB_0013fbf4;
        }
        local_1a8 = pRVar6;
        uVar3 = ref_mpi_gather_recv(local_188,local_1c0,uVar3,2,local_18c);
        if (uVar3 != 0) {
          printf("%s: %d: %s: %d %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c",
                 0x2ac,"ref_gather_cell_id_tec",(ulong)uVar3,"recv c2n");
          return uVar3;
        }
        uVar8 = (long)(int)uVar4 * (long)local_1c4;
        if ((int)local_1a0 == 0) {
          if (0 < (int)uVar8) {
            uVar9 = 0;
            do {
              plVar1 = (long *)((long)local_1c0 + uVar9 * 8);
              *plVar1 = *plVar1 + 1;
              uVar9 = uVar9 + 1;
            } while ((uVar8 & 0xffffffff) != uVar9);
          }
          if (0 < local_1c4) {
            lVar13 = 0;
            pvVar5 = local_1c0;
            local_1b0 = sVar15;
            do {
              if (0 < (int)uVar4) {
                uVar8 = 0;
                do {
                  fprintf((FILE *)file," %ld",*(undefined8 *)((long)pvVar5 + uVar8 * 8));
                  uVar8 = uVar8 + 1;
                } while (uVar16 != uVar8);
              }
              fputc(10,(FILE *)file);
              lVar13 = lVar13 + 1;
              pvVar5 = (void *)((long)pvVar5 + (long)local_198);
              sVar15 = local_1b0;
              RVar12 = local_18c;
            } while (lVar13 < local_1c4);
          }
        }
        else {
          if (0 < (int)uVar8) {
            uVar9 = 0;
            do {
              *(undefined4 *)((long)local_1a8 + uVar9 * 4) =
                   *(undefined4 *)((long)local_1c0 + uVar9 * 8);
              uVar9 = uVar9 + 1;
            } while ((uVar8 & 0xffffffff) != uVar9);
          }
          sVar7 = fwrite(local_1a8,4,uVar8,(FILE *)file);
          if (sVar7 != uVar8) {
            local_1b0 = sVar7;
            printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c"
                   ,0x2b4,"ref_gather_cell_id_tec","int c2n",uVar8,sVar7);
            local_1c8 = 1;
            sVar7 = local_1b0;
          }
          if (sVar7 != uVar8) {
            return local_1c8;
          }
        }
        sVar15 = sVar15 + (long)local_1c4;
        free(local_1a8);
        free(local_1c0);
        RVar12 = RVar12 + 1;
        ref_mpi = local_188;
      } while (RVar12 < local_188->n);
    }
  }
  else {
    local_1c4 = 0;
    if (0 < ref_cell->max) {
      iVar14 = 0;
      do {
        RVar2 = ref_cell_nodes(ref_cell,iVar14,local_178);
        if ((RVar2 == 0) && (local_178[ref_cell->node_per] == cell_id)) {
          uVar3 = ref_cell_part(ref_cell,local_198,iVar14,&local_1b4);
          if (uVar3 != 0) {
            printf("%s: %d: %s: %d %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c"
                   ,0x2c9,"ref_gather_cell_id_tec",(ulong)uVar3,"part");
            return uVar3;
          }
          if (ref_mpi->id == local_1b4) {
            local_1c4 = local_1c4 + 1;
          }
          cell_id = (REF_INT)local_1c0;
        }
        iVar14 = iVar14 + 1;
      } while (iVar14 < ref_cell->max);
    }
    uVar3 = ref_mpi_gather_send(ref_mpi,&local_1c4,1,1);
    if (uVar3 != 0) {
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c",
             0x2cd,"ref_gather_cell_id_tec",(ulong)uVar3,"send ncell");
      return uVar3;
    }
    if ((int)(local_1c4 * uVar4) < 0) {
      uVar10 = 0x2ce;
LAB_0013fb9f:
      printf("%s: %d: %s: %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c",
             uVar10,"ref_gather_cell_id_tec","malloc c2n of REF_GLOB negative");
      return 1;
    }
    local_1a0 = malloc((ulong)(local_1c4 * uVar4) << 3);
    if (local_1a0 == (void *)0x0) {
      pcVar11 = "malloc c2n of REF_GLOB NULL";
      uVar10 = 0x2ce;
      local_1a0 = (void *)0x0;
LAB_0013fbf4:
      printf("%s: %d: %s: %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c",
             uVar10,"ref_gather_cell_id_tec",pcVar11);
      return 2;
    }
    local_1c4 = 0;
    if (0 < ref_cell->max) {
      iVar14 = 0;
      do {
        RVar2 = ref_cell_nodes(ref_cell,iVar14,local_178);
        if ((RVar2 == 0) && (local_178[ref_cell->node_per] == cell_id)) {
          uVar3 = ref_cell_part(ref_cell,local_198,iVar14,&local_1b4);
          if (uVar3 != 0) {
            printf("%s: %d: %s: %d %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c"
                   ,0x2d2,"ref_gather_cell_id_tec",(ulong)uVar3,"part");
            return uVar3;
          }
          cell_id = (REF_INT)local_1c0;
          if (ref_mpi->id == local_1b4) {
            if (0 < (int)uVar4) {
              uVar8 = 0;
              do {
                *(REF_GLOB *)((long)local_1a0 + uVar8 * 8 + (long)(int)uVar4 * (long)local_1c4 * 8)
                     = local_1a8[local_178[uVar8]];
                uVar8 = uVar8 + 1;
              } while (uVar16 != uVar8);
            }
            local_1c4 = local_1c4 + 1;
          }
        }
        iVar14 = iVar14 + 1;
      } while (iVar14 < ref_cell->max);
    }
    uVar4 = ref_mpi_gather_send(ref_mpi,local_1a0,uVar4 * local_1c4,2);
    if (uVar4 != 0) {
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c",
             0x2db,"ref_gather_cell_id_tec",(ulong)uVar4,"send c2n");
      return uVar4;
    }
    free(local_1a0);
    sVar15 = local_1b0;
  }
  if ((ref_mpi->id == 0) && (sVar15 != local_180)) {
    printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c",0x2e1,
           "ref_gather_cell_id_tec","cell count mismatch",local_180,sVar15);
    local_1c8 = 1;
  }
  else {
    local_1c8 = 0;
  }
  return local_1c8;
}

Assistant:

REF_FCN static REF_STATUS ref_gather_cell_id_tec(
    REF_NODE ref_node, REF_CELL ref_cell, REF_INT cell_id,
    REF_LONG ncell_expected, REF_GLOB *l2c, REF_BOOL binary, FILE *file) {
  REF_MPI ref_mpi = ref_node_mpi(ref_node);
  REF_INT cell, node;
  REF_INT nodes[REF_CELL_MAX_SIZE_PER];
  REF_GLOB globals[REF_CELL_MAX_SIZE_PER];
  REF_INT node_per = ref_cell_node_per(ref_cell);
  REF_GLOB *c2n;
  REF_INT *int_c2n;
  REF_INT proc, part, ncell;
  REF_LONG ncell_actual;

  ncell_actual = 0;

  if (ref_mpi_once(ref_mpi)) {
    each_ref_cell_valid_cell_with_nodes(ref_cell, cell, nodes) {
      if (cell_id == nodes[ref_cell_id_index(ref_cell)]) {
        RSS(ref_cell_part(ref_cell, ref_node, cell, &part), "part");
        if (ref_mpi_rank(ref_mpi) == part) {
          for (node = 0; node < node_per; node++) {
            globals[node] = l2c[nodes[node]];
          }
          if (binary) {
            for (node = 0; node < node_per; node++) {
              int int_node;
              int_node = (int)globals[node]; /* binary zero-based */
              REIS(1, fwrite(&int_node, sizeof(int), 1, file), "int c2n");
            }
          } else {
            for (node = 0; node < node_per; node++) {
              globals[node]++; /* ascii one-based */
              fprintf(file, " " REF_GLOB_FMT, globals[node]);
            }
            fprintf(file, "\n");
          }
          ncell_actual++;
        }
      }
    }
  }

  if (ref_mpi_once(ref_mpi)) {
    each_ref_mpi_worker(ref_mpi, proc) {
      RSS(ref_mpi_gather_recv(ref_mpi, &ncell, 1, REF_INT_TYPE, proc),
          "recv ncell");
      ref_malloc(c2n, ncell * node_per, REF_GLOB);
      ref_malloc(int_c2n, ncell * node_per, REF_INT);
      RSS(ref_mpi_gather_recv(ref_mpi, c2n, ncell * node_per, REF_GLOB_TYPE,
                              proc),
          "recv c2n");

      if (binary) { /* binary 0-based int, ASCII 1-based */
        for (cell = 0; cell < ncell * node_per; cell++) {
          int_c2n[cell] = (REF_INT)c2n[cell];
        }
        REIS(ncell * node_per,
             fwrite(int_c2n, sizeof(int), (size_t)(ncell * node_per), file),
             "int c2n");
      } else {
        for (cell = 0; cell < ncell * node_per; cell++) {
          c2n[cell]++;
        }
        for (cell = 0; cell < ncell; cell++) {
          for (node = 0; node < node_per; node++) {
            fprintf(file, " " REF_GLOB_FMT, c2n[node + node_per * cell]);
          }
          fprintf(file, "\n");
        }
      }
      ncell_actual += ncell;

      ref_free(int_c2n);
      ref_free(c2n);
    }
  } else {
    ncell = 0;
    each_ref_cell_valid_cell_with_nodes(ref_cell, cell, nodes) {
      if (cell_id == nodes[ref_cell_id_index(ref_cell)]) {
        RSS(ref_cell_part(ref_cell, ref_node, cell, &part), "part");
        if (ref_mpi_rank(ref_mpi) == part) ncell++;
      }
    }
    RSS(ref_mpi_gather_send(ref_mpi, &ncell, 1, REF_INT_TYPE), "send ncell");
    ref_malloc(c2n, ncell * node_per, REF_GLOB);
    ncell = 0;
    each_ref_cell_valid_cell_with_nodes(ref_cell, cell, nodes) {
      if (cell_id == nodes[ref_cell_id_index(ref_cell)]) {
        RSS(ref_cell_part(ref_cell, ref_node, cell, &part), "part");
        if (ref_mpi_rank(ref_mpi) == part) {
          for (node = 0; node < node_per; node++)
            c2n[node + node_per * ncell] = l2c[nodes[node]];
          ncell++;
        }
      }
    }
    RSS(ref_mpi_gather_send(ref_mpi, c2n, ncell * node_per, REF_GLOB_TYPE),
        "send c2n");

    ref_free(c2n);
  }

  if (ref_mpi_once(ref_mpi)) {
    REIS(ncell_expected, ncell_actual, "cell count mismatch");
  }

  return REF_SUCCESS;
}